

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params,HeapType type,
          vector<wasm::NameType,_std::allocator<wasm::NameType>_> *vars,Expression *body)

{
  mapped_type mVar1;
  undefined8 *puVar2;
  long lVar3;
  uint __line;
  bool bVar4;
  Type *pTVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var8;
  char *pcVar9;
  long lVar10;
  ulong i;
  key_type *pkVar11;
  char **__k;
  undefined8 in_stack_00000008;
  HeapType local_50;
  HeapType type_local;
  Type local_38;
  Index index;
  
  _Var8.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = name.super_IString.str._M_len;
  local_50.id = (uintptr_t)vars;
  type_local = type;
  bVar4 = HeapType::isSignature(&local_50);
  if (bVar4) {
    std::make_unique<wasm::Function>();
    puVar2 = *(undefined8 **)
              _Var8.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *puVar2 = name.super_IString.str._M_str;
    puVar2[1] = params;
    lVar10 = *(long *)_Var8.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(uintptr_t *)(lVar10 + 0x38) = local_50.id;
    *(undefined8 *)(lVar10 + 0x60) = in_stack_00000008;
    lVar10 = 0;
    i = 0;
    while( true ) {
      lVar3 = *(long *)type_local.id;
      if ((ulong)((*(long *)(type_local.id + 8) - lVar3) / 0x18) <= i) {
        pkVar11 = (key_type *)(body->type).id;
        for (__k = *(char ***)body; (key_type *)__k != pkVar11; __k = __k + 3) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     (*(long *)_Var8.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x48),
                     (value_type *)(__k + 2));
          mVar1 = *(mapped_type *)
                   (*(long *)_Var8.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x80);
          local_38.id._0_4_ = mVar1;
          pmVar6 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)(*(long *)_Var8.
                                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                             .super__Head_base<0UL,_wasm::Function_*,_false>.
                                             _M_head_impl + 0xa0),(key_type *)__k);
          *pmVar6 = mVar1;
          pmVar7 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(*(long *)_Var8.
                                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                             .super__Head_base<0UL,_wasm::Function_*,_false>.
                                             _M_head_impl + 0x68),(key_type *)&local_38);
          pcVar9 = __k[1];
          (pmVar7->super_IString).str._M_len = (size_t)*__k;
          (pmVar7->super_IString).str._M_str = pcVar9;
        }
        return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
               (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
               _Var8.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      }
      local_38.id = ::wasm::HeapType::getSignature();
      pTVar5 = Type::operator[](&local_38,i);
      if (pTVar5->id != *(uintptr_t *)(lVar3 + 0x10 + lVar10)) break;
      pkVar11 = (key_type *)(lVar3 + lVar10);
      mVar1 = *(mapped_type *)
               (*(long *)_Var8.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x80);
      local_38.id._0_4_ = mVar1;
      pmVar6 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(*(long *)_Var8.
                                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl + 0xa0),pkVar11);
      *pmVar6 = mVar1;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(*(long *)_Var8.
                                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl + 0x68),(key_type *)&local_38);
      pcVar9 = (pkVar11->super_IString).str._M_str;
      (pmVar7->super_IString).str._M_len = (pkVar11->super_IString).str._M_len;
      (pmVar7->super_IString).str._M_str = pcVar9;
      i = i + 1;
      lVar10 = lVar10 + 0x18;
    }
    pcVar9 = "func->getParams()[i] == param.type";
    __line = 0x47;
  }
  else {
    pcVar9 = "type.isSignature()";
    __line = 0x40;
  }
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,__line,
                "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
               );
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                std::vector<NameType>&& params,
                                                HeapType type,
                                                std::vector<NameType>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    for (size_t i = 0; i < params.size(); ++i) {
      NameType& param = params[i];
      assert(func->getParams()[i] == param.type);
      Index index = func->localNames.size();
      func->localIndices[param.name] = index;
      func->localNames[index] = param.name;
    }
    for (auto& var : vars) {
      func->vars.push_back(var.type);
      Index index = func->localNames.size();
      func->localIndices[var.name] = index;
      func->localNames[index] = var.name;
    }
    return func;
  }